

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

void lablremap(void)

{
  int local_1c;
  t_symbol *ptStack_18;
  int i;
  t_symbol *local;
  t_symbol *sym;
  
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    for (local = hash_tbl[local_1c]; local != (t_symbol *)0x0; local = local->next) {
      if (local->bank <= bank_limit) {
        local->bank = bank_base + local->bank;
      }
      if (local->local != (t_symbol *)0x0) {
        for (ptStack_18 = local->local; ptStack_18 != (t_symbol *)0x0; ptStack_18 = ptStack_18->next
            ) {
          if (ptStack_18->bank <= bank_limit) {
            ptStack_18->bank = bank_base + ptStack_18->bank;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
lablremap(void)
{
	struct t_symbol *sym;
	struct t_symbol *local;
	int i;

	/* browse the symbol table */
	for (i = 0; i < 256; i++) {
		sym = hash_tbl[i];
		while (sym) {
			/* remap the bank */
			if (sym->bank <= bank_limit)
				sym->bank += bank_base;

			/* local symbols */
			if (sym->local) {
				local = sym->local;

				while  (local) {
					if (local->bank <= bank_limit)
						local->bank += bank_base;

					/* next */
					local = local->next;
				}
			}

			/* next */
			sym = sym->next;
		}
	}
}